

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_buffered_batch_collector.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalBufferedBatchCollector::GetGlobalSinkState
          (PhysicalBufferedBatchCollector *this,ClientContext *context)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  pointer pBVar2;
  BufferedData *__tmp;
  templated_unique_single_t state;
  undefined1 local_31;
  __uniq_ptr_impl<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
  local_30;
  enable_shared_from_this<duckdb::ClientContext> local_28;
  
  local_30._M_t.
  super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
  .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl =
       (tuple<duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
        )operator_new(0x78);
  *(_func_int **)
   local_30._M_t.
   super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
   .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   8) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x50) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x58) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x60) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x68) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x10) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x18) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x20) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x28) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x30) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x38) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x40) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x48) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x70) = (_func_int *)0x0;
  *(undefined1 *)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   8) = 1;
  *(undefined1 *)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x50) = 0;
  *(undefined ***)
   local_30._M_t.
   super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
   .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl =
       &PTR__BufferedBatchCollectorGlobalState_024abdf8;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x58) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x60) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x68) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
          .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl +
   0x70) = (_func_int *)0x0;
  enable_shared_from_this<duckdb::ClientContext>::shared_from_this(&local_28);
  pBVar2 = unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
                         *)&local_30);
  (pBVar2->context).internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_28.__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pBVar2->context).internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_28.__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (local_28.__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.__weak_this_.internal.
               super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  pBVar2 = unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
                         *)&local_30);
  local_28.__weak_this_.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::BatchedBufferedData,std::allocator<duckdb::BatchedBufferedData>,duckdb::weak_ptr<duckdb::ClientContext,true>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_28.__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (BatchedBufferedData **)&local_28,(allocator<duckdb::BatchedBufferedData> *)&local_31,
             &pBVar2->context);
  peVar1 = local_28.__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_28.__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.__weak_this_.internal.
       super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.__weak_this_.internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.__weak_this_.internal.
       super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.__weak_this_.internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  if (local_28.__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.__weak_this_.internal.
               super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  pBVar2 = unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
                         *)&local_30);
  (pBVar2->buffered_data).internal.
  super___shared_ptr<duckdb::BufferedData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peVar1;
  this_00 = (pBVar2->buffered_data).internal.
            super___shared_ptr<duckdb::BufferedData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar2->buffered_data).internal.
  super___shared_ptr<duckdb::BufferedData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_28.__weak_this_.internal.
       super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_PhysicalResultCollector).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)
       local_30._M_t.
       super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
       .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalBufferedBatchCollector::GetGlobalSinkState(ClientContext &context) const {
	auto state = make_uniq<BufferedBatchCollectorGlobalState>();
	state->context = context.shared_from_this();
	state->buffered_data = make_shared_ptr<BatchedBufferedData>(state->context);
	return std::move(state);
}